

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_set_value.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  undefined8 uVar2;
  long lVar3;
  char *pcVar4;
  double dVar5;
  char *serialized;
  json_object *tmp;
  char **argv_local;
  int argc_local;
  
  uVar2 = json_object_new_int(0x7b);
  iVar1 = json_object_get_int(uVar2);
  if (iVar1 != 0x7b) {
    __assert_fail("json_object_get_int(tmp) == 123",
                  "/workspace/llm4binary/github/license_c_cmakelists/json-c[P]json-c/tests/test_set_value.c"
                  ,0xd,"int main(int, char **)");
  }
  json_object_set_int(uVar2,0x141);
  iVar1 = json_object_get_int(uVar2);
  if (iVar1 != 0x141) {
    __assert_fail("json_object_get_int(tmp) == 321",
                  "/workspace/llm4binary/github/license_c_cmakelists/json-c[P]json-c/tests/test_set_value.c"
                  ,0xf,"int main(int, char **)");
  }
  printf("INT PASSED\n");
  json_object_set_int64(uVar2,0x1326f969);
  lVar3 = json_object_get_int64(uVar2);
  if (lVar3 != 0x1326f969) {
    __assert_fail("json_object_get_int64(tmp) == 321321321",
                  "/workspace/llm4binary/github/license_c_cmakelists/json-c[P]json-c/tests/test_set_value.c"
                  ,0x12,"int main(int, char **)");
  }
  json_object_put(uVar2);
  printf("INT64 PASSED\n");
  uVar2 = json_object_new_uint64(0x7b);
  iVar1 = json_object_get_boolean(uVar2);
  if (iVar1 != 1) {
    __assert_fail("json_object_get_boolean(tmp) == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/json-c[P]json-c/tests/test_set_value.c"
                  ,0x16,"int main(int, char **)");
  }
  iVar1 = json_object_get_int(uVar2);
  if (iVar1 != 0x7b) {
    __assert_fail("json_object_get_int(tmp) == 123",
                  "/workspace/llm4binary/github/license_c_cmakelists/json-c[P]json-c/tests/test_set_value.c"
                  ,0x17,"int main(int, char **)");
  }
  lVar3 = json_object_get_int64(uVar2);
  if (lVar3 != 0x7b) {
    __assert_fail("json_object_get_int64(tmp) == 123",
                  "/workspace/llm4binary/github/license_c_cmakelists/json-c[P]json-c/tests/test_set_value.c"
                  ,0x18,"int main(int, char **)");
  }
  lVar3 = json_object_get_uint64(uVar2);
  if (lVar3 != 0x7b) {
    __assert_fail("json_object_get_uint64(tmp) == 123",
                  "/workspace/llm4binary/github/license_c_cmakelists/json-c[P]json-c/tests/test_set_value.c"
                  ,0x19,"int main(int, char **)");
  }
  dVar5 = (double)json_object_get_double(uVar2);
  if ((dVar5 != 123.0) || (NAN(dVar5))) {
    __assert_fail("json_object_get_double(tmp) == 123.000000",
                  "/workspace/llm4binary/github/license_c_cmakelists/json-c[P]json-c/tests/test_set_value.c"
                  ,0x1a,"int main(int, char **)");
  }
  json_object_set_uint64(uVar2,0x1326f969);
  lVar3 = json_object_get_uint64(uVar2);
  if (lVar3 != 0x1326f969) {
    __assert_fail("json_object_get_uint64(tmp) == 321321321",
                  "/workspace/llm4binary/github/license_c_cmakelists/json-c[P]json-c/tests/test_set_value.c"
                  ,0x1c,"int main(int, char **)");
  }
  json_object_set_uint64(uVar2,0x8000000000000000);
  iVar1 = json_object_get_int(uVar2);
  if (iVar1 != 0x7fffffff) {
    __assert_fail("json_object_get_int(tmp) == INT32_MAX",
                  "/workspace/llm4binary/github/license_c_cmakelists/json-c[P]json-c/tests/test_set_value.c"
                  ,0x1e,"int main(int, char **)");
  }
  lVar3 = json_object_get_uint64(uVar2);
  if (lVar3 != -0x8000000000000000) {
    __assert_fail("json_object_get_uint64(tmp) == 9223372036854775808U",
                  "/workspace/llm4binary/github/license_c_cmakelists/json-c[P]json-c/tests/test_set_value.c"
                  ,0x1f,"int main(int, char **)");
  }
  json_object_put(uVar2);
  printf("UINT64 PASSED\n");
  uVar2 = json_object_new_boolean(1);
  iVar1 = json_object_get_boolean(uVar2);
  if (iVar1 != 1) {
    __assert_fail("json_object_get_boolean(tmp) == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/json-c[P]json-c/tests/test_set_value.c"
                  ,0x23,"int main(int, char **)");
  }
  json_object_set_boolean(uVar2,0);
  iVar1 = json_object_get_boolean(uVar2);
  if (iVar1 != 0) {
    __assert_fail("json_object_get_boolean(tmp) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/json-c[P]json-c/tests/test_set_value.c"
                  ,0x25,"int main(int, char **)");
  }
  json_object_set_boolean(uVar2,1);
  iVar1 = json_object_get_boolean(uVar2);
  if (iVar1 != 1) {
    __assert_fail("json_object_get_boolean(tmp) == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/json-c[P]json-c/tests/test_set_value.c"
                  ,0x27,"int main(int, char **)");
  }
  json_object_put(uVar2);
  printf("BOOL PASSED\n");
  uVar2 = json_object_new_double(0x4028ae147ae147ae);
  dVar5 = (double)json_object_get_double(uVar2);
  if ((dVar5 != 12.34) || (NAN(dVar5))) {
    __assert_fail("json_object_get_double(tmp) == 12.34",
                  "/workspace/llm4binary/github/license_c_cmakelists/json-c[P]json-c/tests/test_set_value.c"
                  ,0x2b,"int main(int, char **)");
  }
  json_object_set_double(0x404147ae147ae148,uVar2);
  dVar5 = (double)json_object_get_double(uVar2);
  if ((dVar5 == 34.56) && (!NAN(dVar5))) {
    json_object_set_double(0x40b923570a3d70a4,uVar2);
    dVar5 = (double)json_object_get_double(uVar2);
    if ((dVar5 != 6435.34) || (NAN(dVar5))) {
      __assert_fail("json_object_get_double(tmp) == 6435.34",
                    "/workspace/llm4binary/github/license_c_cmakelists/json-c[P]json-c/tests/test_set_value.c"
                    ,0x2f,"int main(int, char **)");
    }
    json_object_set_double(0x445b1ae4d6e2ef50,uVar2);
    iVar1 = json_object_get_int(uVar2);
    if (iVar1 != 0x7fffffff) {
      __assert_fail("json_object_get_int(tmp) == INT32_MAX",
                    "/workspace/llm4binary/github/license_c_cmakelists/json-c[P]json-c/tests/test_set_value.c"
                    ,0x31,"int main(int, char **)");
    }
    lVar3 = json_object_get_int64(uVar2);
    if (lVar3 != 0x7fffffffffffffff) {
      __assert_fail("json_object_get_int64(tmp) == INT64_MAX",
                    "/workspace/llm4binary/github/license_c_cmakelists/json-c[P]json-c/tests/test_set_value.c"
                    ,0x32,"int main(int, char **)");
    }
    lVar3 = json_object_get_uint64(uVar2);
    if (lVar3 != -1) {
      __assert_fail("json_object_get_uint64(tmp) == UINT64_MAX",
                    "/workspace/llm4binary/github/license_c_cmakelists/json-c[P]json-c/tests/test_set_value.c"
                    ,0x33,"int main(int, char **)");
    }
    json_object_set_double(0xc45b1ae4d6e2ef50,uVar2);
    iVar1 = json_object_get_int(uVar2);
    if (iVar1 != -0x80000000) {
      __assert_fail("json_object_get_int(tmp) == INT32_MIN",
                    "/workspace/llm4binary/github/license_c_cmakelists/json-c[P]json-c/tests/test_set_value.c"
                    ,0x35,"int main(int, char **)");
    }
    lVar3 = json_object_get_int64(uVar2);
    if (lVar3 != -0x8000000000000000) {
      __assert_fail("json_object_get_int64(tmp) == INT64_MIN",
                    "/workspace/llm4binary/github/license_c_cmakelists/json-c[P]json-c/tests/test_set_value.c"
                    ,0x36,"int main(int, char **)");
    }
    lVar3 = json_object_get_uint64(uVar2);
    if (lVar3 != 0) {
      __assert_fail("json_object_get_uint64(tmp) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/json-c[P]json-c/tests/test_set_value.c"
                    ,0x37,"int main(int, char **)");
    }
    json_object_put(uVar2);
    printf("DOUBLE PASSED\n");
    uVar2 = json_object_new_string("A MID STRING");
    pcVar4 = (char *)json_object_get_string(uVar2);
    iVar1 = strcmp(pcVar4,"A MID STRING");
    if (iVar1 != 0) {
      __assert_fail("strcmp(json_object_get_string(tmp), MID) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/json-c[P]json-c/tests/test_set_value.c"
                    ,0x3f,"int main(int, char **)");
    }
    pcVar4 = (char *)json_object_to_json_string(uVar2);
    iVar1 = strcmp(pcVar4,"\"A MID STRING\"");
    if (iVar1 != 0) {
      __assert_fail("strcmp(json_object_to_json_string(tmp), \"\\\"\" MID \"\\\"\") == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/json-c[P]json-c/tests/test_set_value.c"
                    ,0x40,"int main(int, char **)");
    }
    json_object_set_string(uVar2,"SHORT");
    pcVar4 = (char *)json_object_get_string(uVar2);
    iVar1 = strcmp(pcVar4,"SHORT");
    if (iVar1 != 0) {
      __assert_fail("strcmp(json_object_get_string(tmp), SHORT) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/json-c[P]json-c/tests/test_set_value.c"
                    ,0x42,"int main(int, char **)");
    }
    pcVar4 = (char *)json_object_to_json_string(uVar2);
    iVar1 = strcmp(pcVar4,"\"SHORT\"");
    if (iVar1 != 0) {
      __assert_fail("strcmp(json_object_to_json_string(tmp), \"\\\"\" SHORT \"\\\"\") == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/json-c[P]json-c/tests/test_set_value.c"
                    ,0x43,"int main(int, char **)");
    }
    json_object_set_string(uVar2,"A string longer than 32 chars as to check non local buf codepath")
    ;
    pcVar4 = (char *)json_object_get_string(uVar2);
    iVar1 = strcmp(pcVar4,"A string longer than 32 chars as to check non local buf codepath");
    if (iVar1 != 0) {
      __assert_fail("strcmp(json_object_get_string(tmp), HUGE) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/json-c[P]json-c/tests/test_set_value.c"
                    ,0x45,"int main(int, char **)");
    }
    pcVar4 = (char *)json_object_to_json_string(uVar2);
    iVar1 = strcmp(pcVar4,"\"A string longer than 32 chars as to check non local buf codepath\"");
    if (iVar1 != 0) {
      __assert_fail("strcmp(json_object_to_json_string(tmp), \"\\\"\" HUGE \"\\\"\") == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/json-c[P]json-c/tests/test_set_value.c"
                    ,0x46,"int main(int, char **)");
    }
    json_object_set_string(uVar2,"SHORT");
    pcVar4 = (char *)json_object_get_string(uVar2);
    iVar1 = strcmp(pcVar4,"SHORT");
    if (iVar1 != 0) {
      __assert_fail("strcmp(json_object_get_string(tmp), SHORT) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/json-c[P]json-c/tests/test_set_value.c"
                    ,0x48,"int main(int, char **)");
    }
    pcVar4 = (char *)json_object_to_json_string(uVar2);
    iVar1 = strcmp(pcVar4,"\"SHORT\"");
    if (iVar1 == 0) {
      json_object_set_string(uVar2,"");
      json_object_set_string
                (uVar2,"A string longer than 32 chars as to check non local buf codepath");
      json_object_set_string(uVar2,"");
      json_object_set_string
                (uVar2,"A string longer than 32 chars as to check non local buf codepath");
      json_object_put(uVar2);
      printf("STRING PASSED\n");
      uVar2 = json_object_new_string("STR");
      dVar5 = (double)json_object_get_double(uVar2);
      if ((dVar5 != 0.0) || (NAN(dVar5))) {
        __assert_fail("json_object_get_double(tmp) == 0.0",
                      "/workspace/llm4binary/github/license_c_cmakelists/json-c[P]json-c/tests/test_set_value.c"
                      ,0x5c,"int main(int, char **)");
      }
      json_object_set_string(uVar2,"123.123");
      dVar5 = (double)json_object_get_double(uVar2);
      if ((dVar5 != 123.123) || (NAN(dVar5))) {
        __assert_fail("json_object_get_double(tmp) == 123.123000",
                      "/workspace/llm4binary/github/license_c_cmakelists/json-c[P]json-c/tests/test_set_value.c"
                      ,0x5e,"int main(int, char **)");
      }
      json_object_set_string(uVar2,"12E+3");
      dVar5 = (double)json_object_get_double(uVar2);
      if ((dVar5 != 12000.0) || (NAN(dVar5))) {
        __assert_fail("json_object_get_double(tmp) == 12000.000000",
                      "/workspace/llm4binary/github/license_c_cmakelists/json-c[P]json-c/tests/test_set_value.c"
                      ,0x60,"int main(int, char **)");
      }
      json_object_set_string(uVar2,"123.123STR");
      dVar5 = (double)json_object_get_double(uVar2);
      if ((dVar5 == 0.0) && (!NAN(dVar5))) {
        json_object_set_string(uVar2,"1.8E+308");
        dVar5 = (double)json_object_get_double(uVar2);
        if ((dVar5 != 0.0) || (NAN(dVar5))) {
          __assert_fail("json_object_get_double(tmp) == 0.0",
                        "/workspace/llm4binary/github/license_c_cmakelists/json-c[P]json-c/tests/test_set_value.c"
                        ,100,"int main(int, char **)");
        }
        json_object_set_string(uVar2,"-1.8E+308");
        dVar5 = (double)json_object_get_double(uVar2);
        if ((dVar5 == 0.0) && (!NAN(dVar5))) {
          json_object_put(uVar2);
          printf("STRINGTODOUBLE PASSED\n");
          uVar2 = json_tokener_parse("1.234");
          json_object_set_double(0x402899999999999a,uVar2);
          pcVar4 = (char *)json_object_to_json_string(uVar2);
          fprintf(_stderr,"%s\n",pcVar4);
          iVar1 = strncmp(pcVar4,"12.3",4);
          if (iVar1 == 0) {
            json_object_put(uVar2);
            printf("PARSE AND SET PASSED\n");
            printf("PASSED\n");
            return 0;
          }
          __assert_fail("strncmp(serialized, \"12.3\", 4) == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/json-c[P]json-c/tests/test_set_value.c"
                        ,0x6e,"int main(int, char **)");
        }
        __assert_fail("json_object_get_double(tmp) == 0.0",
                      "/workspace/llm4binary/github/license_c_cmakelists/json-c[P]json-c/tests/test_set_value.c"
                      ,0x66,"int main(int, char **)");
      }
      __assert_fail("json_object_get_double(tmp) == 0.0",
                    "/workspace/llm4binary/github/license_c_cmakelists/json-c[P]json-c/tests/test_set_value.c"
                    ,0x62,"int main(int, char **)");
    }
    __assert_fail("strcmp(json_object_to_json_string(tmp), \"\\\"\" SHORT \"\\\"\") == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/json-c[P]json-c/tests/test_set_value.c"
                  ,0x49,"int main(int, char **)");
  }
  __assert_fail("json_object_get_double(tmp) == 34.56",
                "/workspace/llm4binary/github/license_c_cmakelists/json-c[P]json-c/tests/test_set_value.c"
                ,0x2d,"int main(int, char **)");
}

Assistant:

int main(int argc, char **argv)
{
	json_object *tmp = json_object_new_int(123);
	assert(json_object_get_int(tmp) == 123);
	json_object_set_int(tmp, 321);
	assert(json_object_get_int(tmp) == 321);
	printf("INT PASSED\n");
	json_object_set_int64(tmp, (int64_t)321321321);
	assert(json_object_get_int64(tmp) == 321321321);
	json_object_put(tmp);
	printf("INT64 PASSED\n");
	tmp = json_object_new_uint64(123);
	assert(json_object_get_boolean(tmp) == 1);
	assert(json_object_get_int(tmp) == 123);
	assert(json_object_get_int64(tmp) == 123);
	assert(json_object_get_uint64(tmp) == 123);
	assert(json_object_get_double(tmp) == 123.000000);
	json_object_set_uint64(tmp, (uint64_t)321321321);
	assert(json_object_get_uint64(tmp) == 321321321);
	json_object_set_uint64(tmp, 9223372036854775808U);
	assert(json_object_get_int(tmp) == INT32_MAX);
	assert(json_object_get_uint64(tmp) == 9223372036854775808U);
	json_object_put(tmp);
	printf("UINT64 PASSED\n");
	tmp = json_object_new_boolean(1);
	assert(json_object_get_boolean(tmp) == 1);
	json_object_set_boolean(tmp, 0);
	assert(json_object_get_boolean(tmp) == 0);
	json_object_set_boolean(tmp, 1);
	assert(json_object_get_boolean(tmp) == 1);
	json_object_put(tmp);
	printf("BOOL PASSED\n");
	tmp = json_object_new_double(12.34);
	assert(json_object_get_double(tmp) == 12.34);
	json_object_set_double(tmp, 34.56);
	assert(json_object_get_double(tmp) == 34.56);
	json_object_set_double(tmp, 6435.34);
	assert(json_object_get_double(tmp) == 6435.34);
	json_object_set_double(tmp, 2e21);
	assert(json_object_get_int(tmp) == INT32_MAX);
	assert(json_object_get_int64(tmp) == INT64_MAX);
	assert(json_object_get_uint64(tmp) == UINT64_MAX);
	json_object_set_double(tmp, -2e21);
	assert(json_object_get_int(tmp) == INT32_MIN);
	assert(json_object_get_int64(tmp) == INT64_MIN);
	assert(json_object_get_uint64(tmp) == 0);
	json_object_put(tmp);
	printf("DOUBLE PASSED\n");
#define SHORT "SHORT"
#define MID "A MID STRING"
//             12345678901234567890123456789012....
#define HUGE "A string longer than 32 chars as to check non local buf codepath"
	tmp = json_object_new_string(MID);
	assert(strcmp(json_object_get_string(tmp), MID) == 0);
	assert(strcmp(json_object_to_json_string(tmp), "\"" MID "\"") == 0);
	json_object_set_string(tmp, SHORT);
	assert(strcmp(json_object_get_string(tmp), SHORT) == 0);
	assert(strcmp(json_object_to_json_string(tmp), "\"" SHORT "\"") == 0);
	json_object_set_string(tmp, HUGE);
	assert(strcmp(json_object_get_string(tmp), HUGE) == 0);
	assert(strcmp(json_object_to_json_string(tmp), "\"" HUGE "\"") == 0);
	json_object_set_string(tmp, SHORT);
	assert(strcmp(json_object_get_string(tmp), SHORT) == 0);
	assert(strcmp(json_object_to_json_string(tmp), "\"" SHORT "\"") == 0);

	// Set an empty string a couple times to try to trigger
	// a case that used to leak memory.
	json_object_set_string(tmp, "");
	json_object_set_string(tmp, HUGE);
	json_object_set_string(tmp, "");
	json_object_set_string(tmp, HUGE);

	json_object_put(tmp);
	printf("STRING PASSED\n");

#define STR "STR"
#define DOUBLE "123.123"
#define DOUBLE_E "12E+3"
#define DOUBLE_STR "123.123STR"
#define DOUBLE_OVER "1.8E+308"
#define DOUBLE_OVER_NEGATIVE "-1.8E+308"
	tmp = json_object_new_string(STR);
	assert(json_object_get_double(tmp) == 0.0);
	json_object_set_string(tmp, DOUBLE);
	assert(json_object_get_double(tmp) == 123.123000);
	json_object_set_string(tmp, DOUBLE_E);
	assert(json_object_get_double(tmp) == 12000.000000);
	json_object_set_string(tmp, DOUBLE_STR);
	assert(json_object_get_double(tmp) == 0.0);
	json_object_set_string(tmp, DOUBLE_OVER);
	assert(json_object_get_double(tmp) == 0.0);
	json_object_set_string(tmp, DOUBLE_OVER_NEGATIVE);
	assert(json_object_get_double(tmp) == 0.0);
	json_object_put(tmp);
	printf("STRINGTODOUBLE PASSED\n");

	tmp = json_tokener_parse("1.234");
	json_object_set_double(tmp, 12.3);
	const char *serialized = json_object_to_json_string(tmp);
	fprintf(stderr, "%s\n", serialized);
	assert(strncmp(serialized, "12.3", 4) == 0);
	json_object_put(tmp);
	printf("PARSE AND SET PASSED\n");

	printf("PASSED\n");
	return 0;
}